

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_struct * __thiscall pugi::xml_text::_data(xml_text *this)

{
  bool bVar1;
  xml_node_struct *local_20;
  xml_node_struct *node;
  xml_text *this_local;
  
  if ((this->_root == (xml_node_struct *)0x0) ||
     (bVar1 = impl::anon_unknown_0::is_text_node(this->_root), bVar1)) {
    return this->_root;
  }
  if ((((uint)this->_root->header & 0xf) == 2) && (this->_root->value != (char_t *)0x0)) {
    return this->_root;
  }
  local_20 = this->_root->first_child;
  while( true ) {
    if (local_20 == (xml_node_struct *)0x0) {
      return (xml_node_struct *)0x0;
    }
    bVar1 = impl::anon_unknown_0::is_text_node(local_20);
    if (bVar1) break;
    local_20 = local_20->next_sibling;
  }
  return local_20;
}

Assistant:

PUGI__FN xml_node_struct* xml_text::_data() const
	{
		if (!_root || impl::is_text_node(_root)) return _root;

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI__NODETYPE(_root) == node_element && _root->value)
			return _root;

		for (xml_node_struct* node = _root->first_child; node; node = node->next_sibling)
			if (impl::is_text_node(node))
				return node;

		return 0;
	}